

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rate_adaptive_code.hpp
# Opt level: O0

void LDPC4QKD::RateAdaptiveCode<unsigned_int>::saturate<double>
               (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                *mv,double vsat)

{
  bool bVar1;
  reference this;
  reference pdVar2;
  double *a;
  iterator __end0_1;
  iterator __begin0_1;
  vector<double,_std::allocator<double>_> *__range4;
  vector<double,_std::allocator<double>_> *v;
  iterator __end0;
  iterator __begin0;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *__range3;
  double vsat_local;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *mv_local;
  
  __end0 = std::
           vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ::begin(mv);
  v = (vector<double,_std::allocator<double>_> *)
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::end(mv);
  while (bVar1 = __gnu_cxx::
                 operator==<std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
                           (&__end0,(__normal_iterator<std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
                                     *)&v), ((bVar1 ^ 0xffU) & 1) != 0) {
    this = __gnu_cxx::
           __normal_iterator<std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
           ::operator*(&__end0);
    __end0_1 = std::vector<double,_std::allocator<double>_>::begin(this);
    a = (double *)std::vector<double,_std::allocator<double>_>::end(this);
    while (bVar1 = __gnu_cxx::operator==<double_*,_std::vector<double,_std::allocator<double>_>_>
                             (&__end0_1,
                              (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                               *)&a), ((bVar1 ^ 0xffU) & 1) != 0) {
      pdVar2 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
               ::operator*(&__end0_1);
      if (*pdVar2 <= vsat) {
        if (*pdVar2 < -vsat) {
          *pdVar2 = -vsat;
        }
      }
      else {
        *pdVar2 = vsat;
      }
      __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
      operator++(&__end0_1);
    }
    __gnu_cxx::
    __normal_iterator<std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
    ::operator++(&__end0);
  }
  return;
}

Assistant:

static void saturate(std::vector<std::vector<T>> &mv, const double vsat) {
            for (auto &v : mv) {
                for (auto &a : v) {
                    if (a > vsat) { a = vsat; }
                    else if (a < -vsat) { a = -vsat; }
                }
            }
        }